

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_unnest.cpp
# Opt level: O1

OperatorResultType
duckdb::PhysicalUnnest::ExecuteInternal
          (ExecutionContext *context,DataChunk *input,DataChunk *chunk,OperatorState *state_p,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list,bool include_input)

{
  OperatorState *pOVar1;
  vector<unsigned_long,_true> *this;
  vector<duckdb::Vector,_true> *this_00;
  _func_int **position;
  _func_int **pp_Var2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  value_type vVar5;
  bool bVar6;
  bool bVar7;
  undefined4 uVar8;
  reference pvVar9;
  reference pvVar10;
  _func_int **pp_Var11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  LogicalType *this_01;
  idx_t iVar17;
  Vector *other;
  DataChunk *extraout_RDX;
  DataChunk *extraout_RDX_00;
  long lVar18;
  DataChunk *extraout_RDX_01;
  DataChunk *extraout_RDX_02;
  DataChunk *extraout_RDX_03;
  DataChunk *extraout_RDX_04;
  DataChunk *extraout_RDX_05;
  DataChunk *extraout_RDX_06;
  DataChunk *select_list_00;
  long lVar19;
  size_type __n;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  size_type __n_00;
  size_type sVar25;
  bool bVar26;
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  undefined1 auVar34 [16];
  ulong local_d8;
  LogicalType local_60;
  LogicalType local_48;
  
  pOVar1 = state_p + 1;
  this = (vector<unsigned_long,_true> *)(state_p + 0x10);
  this_00 = (vector<duckdb::Vector,_true> *)(state_p + 0x1c);
  select_list_00 = chunk;
  do {
    if (*(char *)&state_p[6]._vptr_OperatorState == '\x01') {
      UnnestOperatorState::PrepareInput
                ((UnnestOperatorState *)state_p,input,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)select_list_00);
      select_list_00 = extraout_RDX;
    }
    position = pOVar1->_vptr_OperatorState;
    if ((_func_int **)input->count <= position) {
      pOVar1->_vptr_OperatorState = (_func_int **)0x0;
      state_p[2]._vptr_OperatorState = (_func_int **)0x0;
      *(undefined1 *)&state_p[6]._vptr_OperatorState = 1;
      return NEED_MORE_INPUT;
    }
    if (state_p[0x1d]._vptr_OperatorState != state_p[0x1c]._vptr_OperatorState) {
      __n_00 = 0;
      do {
        pvVar9 = vector<unsigned_long,_true>::operator[](this,__n_00);
        *pvVar9 = 0;
        __n_00 = __n_00 + 1;
        select_list_00 = extraout_RDX_00;
      } while (__n_00 < (ulong)(((long)state_p[0x1d]._vptr_OperatorState -
                                 (long)state_p[0x1c]._vptr_OperatorState >> 3) * 0x4ec4ec4ec4ec4ec5)
              );
    }
    local_d8 = 0;
    lVar23 = 0;
    auVar34 = _DAT_01de8e80;
    do {
      pp_Var11 = pOVar1->_vptr_OperatorState;
      if ((_func_int **)input->count <= pp_Var11) break;
      uVar24 = (long)state_p[3]._vptr_OperatorState[(long)pp_Var11] -
               (long)state_p[2]._vptr_OperatorState;
      if (0x800 - local_d8 < uVar24) {
        uVar24 = 0x800 - local_d8;
      }
      if ((_func_int **)state_p[3]._vptr_OperatorState[(long)pp_Var11] !=
          state_p[2]._vptr_OperatorState) {
        if (include_input) {
          pp_Var2 = state_p[7]._vptr_OperatorState;
          lVar18 = uVar24 + (uVar24 == 0);
          lVar19 = lVar18 + -1;
          auVar27._8_4_ = (int)lVar19;
          auVar27._0_8_ = lVar19;
          auVar27._12_4_ = (int)((ulong)lVar19 >> 0x20);
          auVar27 = auVar27 ^ auVar34;
          uVar20 = 0;
          auVar30 = _DAT_01df1070;
          auVar32 = _DAT_01df1090;
          do {
            auVar31 = auVar30 ^ auVar34;
            iVar29 = auVar27._4_4_;
            uVar8 = SUB84(pp_Var11,0);
            if ((bool)(~(auVar31._4_4_ == iVar29 && auVar27._0_4_ < auVar31._0_4_ ||
                        iVar29 < auVar31._4_4_) & 1)) {
              *(undefined4 *)((long)pp_Var2 + uVar20 + local_d8 * 4) = uVar8;
            }
            if ((auVar31._12_4_ != auVar27._12_4_ || auVar31._8_4_ <= auVar27._8_4_) &&
                auVar31._12_4_ <= auVar27._12_4_) {
              *(undefined4 *)((long)pp_Var2 + uVar20 + local_d8 * 4 + 4) = uVar8;
            }
            iVar33 = SUB164(auVar32 ^ auVar34,4);
            if (iVar33 <= iVar29 &&
                (iVar33 != iVar29 || SUB164(auVar32 ^ auVar34,0) <= auVar27._0_4_)) {
              *(undefined4 *)((long)pp_Var2 + uVar20 + local_d8 * 4 + 8) = uVar8;
              *(undefined4 *)((long)pp_Var2 + uVar20 + local_d8 * 4 + 0xc) = uVar8;
            }
            lVar19 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar19 + 4;
            lVar19 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 4;
            auVar32._8_8_ = lVar19 + 4;
            uVar20 = uVar20 + 0x10;
          } while ((lVar18 * 4 + 0xcU & 0xfffffffffffffff0) != uVar20);
        }
        if (state_p[0x1d]._vptr_OperatorState != state_p[0x1c]._vptr_OperatorState) {
          __n = 0;
          do {
            pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)(state_p + 0x24),__n);
            pp_Var11 = pOVar1->_vptr_OperatorState;
            psVar3 = pvVar10->sel->sel_vector;
            if (psVar3 != (sel_t *)0x0) {
              pp_Var11 = (_func_int **)(ulong)psVar3[(long)pp_Var11];
            }
            puVar4 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) ||
               ((puVar4[(ulong)pp_Var11 >> 6] >> ((ulong)pp_Var11 & 0x3f) & 1) != 0)) {
              iVar29 = (int)*(undefined8 *)(pvVar10->data + (long)pp_Var11 * 0x10);
              pp_Var11 = *(_func_int ***)(pvVar10->data + (long)pp_Var11 * 0x10 + 8);
            }
            else {
              iVar29 = 0;
              pp_Var11 = (_func_int **)0x0;
            }
            uVar20 = 0;
            if (state_p[2]._vptr_OperatorState <= pp_Var11) {
              uVar20 = (long)pp_Var11 - (long)state_p[2]._vptr_OperatorState;
            }
            uVar22 = uVar24;
            if (uVar20 < uVar24) {
              uVar22 = uVar20;
            }
            pvVar12 = vector<duckdb::SelectionVector,_true>::operator[]
                                ((vector<duckdb::SelectionVector,_true> *)(state_p + 10),__n);
            auVar34 = _DAT_01de8e80;
            if (uVar22 != 0) {
              psVar3 = pvVar12->sel_vector;
              lVar19 = uVar22 - 1;
              auVar28._8_4_ = (int)lVar19;
              auVar28._0_8_ = lVar19;
              auVar28._12_4_ = (int)((ulong)lVar19 >> 0x20);
              iVar33 = (int)state_p[2]._vptr_OperatorState;
              uVar21 = 0;
              auVar31 = _DAT_01df1070;
              do {
                auVar30 = auVar28 ^ auVar34;
                auVar32 = auVar31 ^ auVar34;
                if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                            auVar30._4_4_ < auVar32._4_4_) & 1)) {
                  psVar3[local_d8 + uVar21] = iVar29 + iVar33 + (int)uVar21;
                }
                if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
                    auVar32._12_4_ <= auVar30._12_4_) {
                  psVar3[local_d8 + uVar21 + 1] = iVar29 + iVar33 + 1 + (int)uVar21;
                }
                uVar21 = uVar21 + 2;
                lVar19 = auVar31._8_8_;
                auVar31._0_8_ = auVar31._0_8_ + 2;
                auVar31._8_8_ = lVar19 + 2;
              } while (((int)uVar22 + 1U & 0x1ffe) != uVar21);
            }
            pvVar13 = vector<duckdb::SelectionVector,_true>::operator[]
                                ((vector<duckdb::SelectionVector,_true> *)(state_p + 0xd),__n);
            if (uVar20 < uVar24) {
              lVar19 = uVar24 - uVar22;
              lVar18 = uVar22 + local_d8;
              do {
                pvVar12->sel_vector[lVar18] = 0;
                pvVar9 = vector<unsigned_long,_true>::operator[](this,__n);
                vVar5 = *pvVar9;
                *pvVar9 = vVar5 + 1;
                pvVar13->sel_vector[vVar5] = (sel_t)lVar18;
                lVar18 = lVar18 + 1;
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
            __n = __n + 1;
          } while (__n < (ulong)(((long)state_p[0x1d]._vptr_OperatorState -
                                  (long)state_p[0x1c]._vptr_OperatorState >> 3) * 0x4ec4ec4ec4ec4ec5
                                ));
        }
        local_d8 = local_d8 + uVar24;
        state_p[2]._vptr_OperatorState =
             (_func_int **)((long)state_p[2]._vptr_OperatorState + uVar24);
        auVar34 = _DAT_01de8e80;
      }
      select_list_00 = (DataChunk *)state_p[3]._vptr_OperatorState;
      if (state_p[2]._vptr_OperatorState ==
          *(_func_int ***)
           ((long)&(select_list_00->data).
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)state_p[1]._vptr_OperatorState * 8)) {
        state_p[1]._vptr_OperatorState = (_func_int **)((long)state_p[1]._vptr_OperatorState + 1);
        state_p[2]._vptr_OperatorState = (_func_int **)0x0;
      }
      lVar23 = lVar23 + 1;
    } while (local_d8 < 0x800);
    chunk->count = local_d8;
    if (include_input) {
      if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar24 = 0;
      }
      else {
        sVar25 = 0;
        do {
          pvVar14 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar25);
          pvVar15 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar25);
          if (lVar23 == 1) {
            ConstantVector::Reference(pvVar14,pvVar15,(idx_t)position,input->count);
            select_list_00 = extraout_RDX_01;
          }
          else {
            Vector::Slice(pvVar14,pvVar15,(SelectionVector *)(state_p + 7),local_d8);
            select_list_00 = extraout_RDX_02;
          }
          sVar25 = sVar25 + 1;
          uVar24 = ((long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        } while (sVar25 < uVar24);
      }
    }
    else {
      uVar24 = 0;
    }
    if (state_p[0x1d]._vptr_OperatorState != state_p[0x1c]._vptr_OperatorState) {
      sVar25 = 0;
      do {
        pvVar14 = vector<duckdb::Vector,_true>::operator[](this_00,sVar25);
        pvVar15 = vector<duckdb::Vector,_true>::operator[](&chunk->data,uVar24 + sVar25);
        pvVar16 = vector<duckdb::Vector,_true>::operator[](this_00,sVar25);
        LogicalType::LogicalType(&local_48,SQLNULL);
        bVar6 = LogicalType::operator==(&pvVar16->type,&local_48);
        bVar26 = true;
        if (!bVar6) {
          pvVar16 = vector<duckdb::Vector,_true>::operator[](this_00,sVar25);
          this_01 = ListType::GetChildType(&pvVar16->type);
          LogicalType::LogicalType(&local_60,SQLNULL);
          bVar7 = LogicalType::operator==(this_01,&local_60);
          if (!bVar7) {
            iVar17 = ListVector::GetListSize(pvVar14);
            bVar26 = iVar17 == 0;
          }
        }
        if (!bVar6) {
          LogicalType::~LogicalType(&local_60);
        }
        LogicalType::~LogicalType(&local_48);
        if (bVar26) {
          Vector::SetVectorType(pvVar15,CONSTANT_VECTOR);
          ConstantVector::SetNull(pvVar15,true);
          select_list_00 = extraout_RDX_03;
        }
        else {
          other = ListVector::GetEntry(pvVar14);
          pvVar12 = vector<duckdb::SelectionVector,_true>::operator[]
                              ((vector<duckdb::SelectionVector,_true> *)(state_p + 10),sVar25);
          Vector::Slice(pvVar15,other,pvVar12,local_d8);
          pvVar9 = vector<unsigned_long,_true>::operator[](this,sVar25);
          select_list_00 = extraout_RDX_04;
          if (*pvVar9 != 0) {
            Vector::Flatten(pvVar15,local_d8);
            pvVar12 = vector<duckdb::SelectionVector,_true>::operator[]
                                ((vector<duckdb::SelectionVector,_true> *)(state_p + 0xd),sVar25);
            pvVar9 = vector<unsigned_long,_true>::operator[](this,sVar25);
            select_list_00 = extraout_RDX_05;
            if (*pvVar9 != 0) {
              uVar20 = 0;
              do {
                uVar22 = uVar20;
                if (pvVar12->sel_vector != (sel_t *)0x0) {
                  uVar22 = (ulong)pvVar12->sel_vector[uVar20];
                }
                FlatVector::SetNull(pvVar15,uVar22,true);
                uVar20 = uVar20 + 1;
                pvVar9 = vector<unsigned_long,_true>::operator[](this,sVar25);
                select_list_00 = extraout_RDX_06;
              } while (uVar20 < *pvVar9);
            }
          }
        }
        sVar25 = sVar25 + 1;
      } while (sVar25 < (ulong)(((long)state_p[0x1d]._vptr_OperatorState -
                                 (long)state_p[0x1c]._vptr_OperatorState >> 3) * 0x4ec4ec4ec4ec4ec5)
              );
    }
    if (chunk->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalUnnest::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   OperatorState &state_p,
                                                   const vector<unique_ptr<Expression>> &select_list,
                                                   bool include_input) {

	auto &state = state_p.Cast<UnnestOperatorState>();

	do {
		// prepare the input data by executing any expressions and getting the
		// UnifiedVectorFormat of each LIST vector (list_vector_data) and its child vector (list_child_data)
		if (state.first_fetch) {
			state.PrepareInput(input, select_list);
		}

		// finished with all rows of this input chunk, reset
		if (state.current_row >= input.size()) {
			state.Reset();
			return OperatorResultType::NEED_MORE_INPUT;
		}

		// we essentially create two different SelectionVectors to slice
		// one is for the input (if include_input is set)
		// the other is for the list we are unnesting
		// construct these
		idx_t result_length = 0;
		idx_t unnest_list_count = 0;
		auto initial_row = state.current_row;
		for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
			state.null_counts[col_idx] = 0;
		}
		while (result_length < STANDARD_VECTOR_SIZE && state.current_row < input.size()) {
			auto current_row_length = MinValue<idx_t>(STANDARD_VECTOR_SIZE - result_length,
			                                          state.unnest_lengths[state.current_row] - state.list_position);

			if (current_row_length > 0) {
				// set up the selection vectors
				if (include_input) {
					for (idx_t r = 0; r < current_row_length; r++) {
						state.input_sel.set_index(result_length + r, state.current_row);
					}
				}
				for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
					auto &vector_data = state.list_vector_data[col_idx];
					auto current_idx = vector_data.sel->get_index(state.current_row);
					idx_t list_length = 0;
					idx_t list_offset = 0;
					if (vector_data.validity.RowIsValid(current_idx)) {
						auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vector_data);
						auto list_entry = list_data[current_idx];
						list_length = list_entry.length;
						list_offset = list_entry.offset;
					}
					// unnest any entries we can
					idx_t unnest_length = MinValue<idx_t>(
					    list_length - MinValue<idx_t>(list_length, state.list_position), current_row_length);
					auto &unnest_sel = state.unnest_sels[col_idx];
					for (idx_t r = 0; r < unnest_length; r++) {
						unnest_sel.set_index(result_length + r, list_offset + state.list_position + r);
					}
					// for any remaining entries (if any) - set them in the null selection
					auto &null_sel = state.null_sels[col_idx];
					for (idx_t r = unnest_length; r < current_row_length; r++) {
						// we unnest the first row in the child list
						// this is chosen arbitrarily - we will override it with `NULL` afterwards
						// FIXME if the child list has a `NULL` entry we can directly unnest that and avoid having
						// to override it - this is a potential optimization we could do in the future
						unnest_sel.set_index(result_length + r, 0);
						null_sel.set_index(state.null_counts[col_idx]++, result_length + r);
					}
				}

				// move to the next row
				result_length += current_row_length;
				state.list_position += current_row_length;
			}
			unnest_list_count++;
			if (state.list_position == state.unnest_lengths[state.current_row]) {
				state.current_row++;
				state.list_position = 0;
			}
		}
		idx_t col_offset = 0;
		chunk.SetCardinality(result_length);
		if (include_input) {
			for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
				if (unnest_list_count == 1) {
					// everything belongs to the same row - we can do a constant reference
					ConstantVector::Reference(chunk.data[col_idx], input.data[col_idx], initial_row, input.size());
				} else {
					// input values come from different rows - we need to slice
					chunk.data[col_idx].Slice(input.data[col_idx], state.input_sel, result_length);
				}
			}
			col_offset = input.ColumnCount();
		}
		for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
			auto &list_vector = state.list_data.data[col_idx];
			auto &result_vector = chunk.data[col_offset + col_idx];
			if (state.list_data.data[col_idx].GetType() == LogicalType::SQLNULL ||
			    ListType::GetChildType(state.list_data.data[col_idx].GetType()) == LogicalType::SQLNULL ||
			    ListVector::GetListSize(list_vector) == 0) {
				// UNNEST(NULL) or UNNEST([])
				// we cannot slice empty lists - but if our child list is empty we can only return NULL anyway
				result_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result_vector, true);
				continue;
			}
			auto &child_vector = ListVector::GetEntry(list_vector);
			result_vector.Slice(child_vector, state.unnest_sels[col_idx], result_length);
			if (state.null_counts[col_idx] > 0) {
				// we have NULL values that we need to set - flatten
				result_vector.Flatten(result_length);
				auto &null_sel = state.null_sels[col_idx];
				for (idx_t idx = 0; idx < state.null_counts[col_idx]; idx++) {
					auto null_index = null_sel.get_index(idx);
					FlatVector::SetNull(result_vector, null_index, true);
				}
			}
		}
	} while (chunk.size() == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}